

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QByteArray * __thiscall QUrl::toEncoded(QUrl *this,FormattingOptions options)

{
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  FormattingOptions in_stack_000000ec;
  undefined4 in_stack_ffffffffffffff78;
  ComponentFormattingOption in_stack_ffffffffffffff7c;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  QFlags<QUrl::ComponentFormattingOption>::operator~
            ((QFlags<QUrl::ComponentFormattingOption> *)in_RDI);
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator&=
            ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)in_RDI,
             (QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>)
             SUB84((ulong)local_c >> 0x20,0));
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|
            ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)in_RDI,
             in_stack_ffffffffffffff7c);
  toString(this,in_stack_000000ec);
  QString::toLatin1((QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QString::~QString((QString *)0x2fe6ee);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QUrl::toEncoded(FormattingOptions options) const
{
    options &= ~(FullyDecoded | FullyEncoded);
    return toString(options | FullyEncoded).toLatin1();
}